

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O2

void __thiscall
syntax_tests::iu_SyntaxTest_x_iutest_x_ExceptionValueEQ_Test::
iu_SyntaxTest_x_iutest_x_ExceptionValueEQ_Test(iu_SyntaxTest_x_iutest_x_ExceptionValueEQ_Test *this)

{
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_003957b8;
  return;
}

Assistant:

IUTEST(SyntaxTest, ExceptionValueEQ)
{
    if( int x = 1 )
        IUTEST_ASSERT_THROW_VALUE_EQ(throw 1, int, x) << x;
    if( int x = 1 )
        IUTEST_EXPECT_THROW_VALUE_EQ(throw 1, int, x) << x;
    if( int x = 1 )
        IUTEST_INFORM_THROW_VALUE_EQ(throw 1, int, x) << x;
    if( int x = 1 )
        IUTEST_ASSUME_THROW_VALUE_EQ(throw 1, int, x) << x;
}